

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void INT_EVdfg_enable_auto_stone(EVdfg_stone stone,int period_sec,int period_usec)

{
  EVdfg_config_action act;
  int in_stack_000000f4;
  EVdfg_configuration in_stack_000000f8;
  undefined1 in_stack_00000110 [32];
  
  EVdfg_perform_act_on_state
            (in_stack_000000f8,(EVdfg_config_action)in_stack_00000110,in_stack_000000f4);
  return;
}

Assistant:

extern void 
INT_EVdfg_enable_auto_stone(EVdfg_stone stone, int period_sec, 
			int period_usec)
{
    EVdfg_config_action act;
    act.type = ACT_set_auto_period;
    act.stone_id = stone->stone_id;
    act.u.period.secs = period_sec;
    act.u.period.usecs = period_usec;
    (void)EVdfg_perform_act_on_state(stone->dfg->working_state, act, 1 /* add to queue */);
}